

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O0

Fad<long_double> * __thiscall
TPZMatrix<Fad<long_double>_>::Get(TPZMatrix<Fad<long_double>_> *this,int64_t row,int64_t col)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  Fad<long_double> *in_RDI;
  
  (**(code **)(*in_RSI + 0x120))(in_RDI,in_RSI,in_RDX,in_RCX);
  return in_RDI;
}

Assistant:

inline const TVar TPZMatrix<TVar>::Get(const int64_t row, const int64_t col ) const {
	// bound checking
#ifdef PZDEBUG
	if ( (row >= Rows()) || (col >= Cols()) || row <0 || col <0 ) {
		Error("TPZMatrix::Get", "Index out of range");
        DebugStop();
	}
#endif
	return( GetVal( row, col ) );
}